

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  ulong uVar1;
  FragmentPacket *packet;
  long lVar2;
  int fragNdx;
  long lVar3;
  Vec4 *value;
  VecAccess<float,_4,_2> local_210;
  VecAccess<float,_4,_2> local_200;
  VecAccess<float,_3,_2> local_1f0;
  float local_1dc;
  VecAccess<float,_3,_2> local_1d8;
  Vec2 texCoords [4];
  VecAccess<float,_4,_2> local_190;
  FragmentPacket *local_180;
  ulong local_178;
  ulong local_170;
  long local_168;
  FragmentPacket *local_160;
  float local_158 [2];
  float local_150;
  float local_148 [2];
  float local_140;
  float local_138 [2];
  float local_130;
  Vec2 transformedTexCoords [4];
  tcu local_104 [12];
  Vec4 outColors [4];
  undefined1 local_b0 [12];
  undefined1 local_a4 [12];
  Vec4 texSamples [4];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  local_170 = 0;
  local_178 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_178 = local_170;
  }
  local_180 = packets;
  while (local_170 != local_178) {
    local_160 = local_180 + local_170;
    local_1dc = 1.0 / (float)*(int *)&(this->super_ShaderProgram).field_0x154;
    tcu::Vector<float,_4>::Vector(outColors,0.0);
    tcu::Vector<float,_4>::Vector(outColors + 1,0.0);
    tcu::Vector<float,_4>::Vector(outColors + 2,0.0);
    tcu::Vector<float,_4>::Vector(outColors + 3,0.0);
    for (lVar2 = 0; uVar1 = local_170, lVar2 < *(int *)&(this->super_ShaderProgram).field_0x154;
        lVar2 = lVar2 + 1) {
      lVar3 = 0;
      do {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)texSamples[0].m_data + lVar3));
        packet = local_160;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x40);
      rr::readTriangleVarying<float>((rr *)&local_1f0,local_160,context,0,0);
      transformedTexCoords[1].m_data[0] = 0.0;
      transformedTexCoords[1].m_data[1] = 1.4013e-45;
      transformedTexCoords[0].m_data = (float  [2])&local_1f0;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_4,_2> *)transformedTexCoords);
      rr::readTriangleVarying<float>((rr *)&local_1d8,packet,context,0,1);
      local_200.m_index[0] = 0;
      local_200.m_index[1] = 1;
      local_200.m_vector = (Vector<float,_4> *)&local_1d8;
      tcu::VecAccess::operator_cast_to_Vector(&local_200);
      rr::readTriangleVarying<float>((rr *)local_40,packet,context,0,2);
      local_210.m_index[0] = 0;
      local_210.m_index[1] = 1;
      local_210.m_vector = (Vector<float,_4> *)local_40;
      tcu::VecAccess::operator_cast_to_Vector(&local_210);
      rr::readTriangleVarying<float>((rr *)local_50,packet,context,0,3);
      local_190.m_index[0] = 0;
      local_190.m_index[1] = 1;
      local_190.m_vector = (Vector<float,_4> *)local_50;
      tcu::VecAccess::operator_cast_to_Vector(&local_190);
      if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar2] == 0xde1) {
        local_168 = lVar2 * 0x24;
        local_190.m_vector = (Vector<float,_4> *)texCoords[0].m_data;
        local_190.m_index[0] = 0x3f800000;
        tcu::operator*((tcu *)local_40,
                       (this->m_transformations).
                       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2,
                       (Vector<float,_3> *)&local_190);
        local_1f0.m_index[0] = 0;
        local_1f0.m_index[1] = 1;
        local_1f0.m_vector = (Vector<float,_3> *)local_40;
        tcu::VecAccess::operator_cast_to_Vector(&local_1f0);
        lVar3 = local_168;
        local_138[0] = texCoords[1].m_data[0];
        local_138[1] = texCoords[1].m_data[1];
        local_130 = 1.0;
        tcu::operator*((tcu *)local_50,
                       (Matrix<float,_3,_3> *)
                       ((long)(((this->m_transformations).
                                super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + local_168),(Vector<float,_3> *)local_138);
        local_200.m_index[0] = 0;
        local_200.m_index[1] = 1;
        local_200.m_vector = (Vector<float,_4> *)local_50;
        tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_3,_2> *)&local_200);
        local_148[0] = texCoords[2].m_data[0];
        local_148[1] = texCoords[2].m_data[1];
        local_140 = 1.0;
        tcu::operator*((tcu *)local_a4,
                       (Matrix<float,_3,_3> *)
                       ((long)(((this->m_transformations).
                                super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + lVar3),(Vector<float,_3> *)local_148);
        local_1d8.m_index[0] = 0;
        local_1d8.m_index[1] = 1;
        local_1d8.m_vector = (Vector<float,_3> *)local_a4;
        tcu::VecAccess::operator_cast_to_Vector(&local_1d8);
        local_158[0] = texCoords[3].m_data[0];
        local_158[1] = texCoords[3].m_data[1];
        local_150 = 1.0;
        tcu::operator*((tcu *)local_b0,
                       (Matrix<float,_3,_3> *)
                       ((long)(((this->m_transformations).
                                super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + lVar3),(Vector<float,_3> *)local_158);
        local_210.m_index[0] = 0;
        local_210.m_index[1] = 1;
        local_210.m_vector = (Vector<float,_4> *)local_b0;
        tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_3,_2> *)&local_210);
        sglr::rc::Texture2D::sample4
                  ((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start[(int)lVar2 * 2].sampler.tex2D,texSamples,
                   transformedTexCoords,0.0);
      }
      else {
        local_1f0.m_vector = (Vector<float,_3> *)texCoords[0].m_data;
        local_1f0.m_index[0] = 0x3f800000;
        tcu::operator*((tcu *)transformedTexCoords,
                       (this->m_transformations).
                       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2,
                       (Vector<float,_3> *)&local_1f0);
        local_200.m_vector = (Vector<float,_4> *)texCoords[1].m_data;
        local_200.m_index[0] = 0x3f800000;
        tcu::operator*((tcu *)(transformedTexCoords[1].m_data + 1),
                       (this->m_transformations).
                       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2,
                       (Vector<float,_3> *)&local_200);
        local_1d8.m_vector = (Vector<float,_3> *)texCoords[2].m_data;
        local_1d8.m_index[0] = 0x3f800000;
        tcu::operator*((tcu *)(transformedTexCoords + 3),
                       (this->m_transformations).
                       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2,
                       (Vector<float,_3> *)&local_1d8);
        local_210.m_vector = (Vector<float,_4> *)texCoords[3].m_data;
        local_210.m_index[0] = 0x3f800000;
        tcu::operator*(local_104,
                       (this->m_transformations).
                       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2,
                       (Vector<float,_3> *)&local_210);
        sglr::rc::TextureCube::sample4
                  ((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start[(int)lVar2 * 2].sampler.texCube,texSamples,
                   (Vec3 *)transformedTexCoords,0.0);
      }
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
        tcu::operator*((tcu *)transformedTexCoords,local_1dc,
                       (Vector<float,_4> *)((long)texSamples[0].m_data + lVar3));
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)((long)outColors[0].m_data + lVar3),
                   (Vector<float,_4> *)transformedTexCoords);
      }
    }
    value = outColors;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>(context,(int)uVar1,(int)lVar2,0,value);
      value = value + 1;
    }
    local_170 = uVar1 + 1;
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
			{
				// Transform
				const tcu::Vec2 transformedTexCoords[4] =
				{
					(m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f)).xy(),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.tex2D->sample4(texSamples, transformedTexCoords);
			}
			else
			{
				DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);

				// Transform
				const tcu::Vec3 transformedTexCoords[4] =
				{
					m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.texCube->sample4(texSamples, transformedTexCoords);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * texSamples[fragNdx];
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}